

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * lshift(Bigint *b,int k)

{
  sbyte sVar1;
  int iVar2;
  Bigint *pBVar3;
  ULong *pUVar4;
  ULong *pUVar5;
  uint *puVar6;
  uint local_4c;
  ULong z;
  ULong *xe;
  ULong *x1;
  ULong *x;
  Bigint *b1;
  int n1;
  int n;
  int k1;
  int i;
  int k_local;
  Bigint *b_local;
  
  n1 = b->k;
  iVar2 = (k >> 5) + b->wds;
  b1._4_4_ = iVar2 + 1;
  for (n = b->maxwds; n < b1._4_4_; n = n << 1) {
    n1 = n1 + 1;
  }
  pBVar3 = Balloc(n1);
  xe = pBVar3->x;
  for (n = 0; n < k >> 5; n = n + 1) {
    *xe = 0;
    xe = xe + 1;
  }
  x1 = b->x;
  pUVar4 = x1 + b->wds;
  if ((k & 0x1fU) == 0) {
    do {
      pUVar5 = x1 + 1;
      *xe = *x1;
      xe = xe + 1;
      x1 = pUVar5;
    } while (pUVar5 < pUVar4);
  }
  else {
    sVar1 = (sbyte)(k & 0x1fU);
    local_4c = 0;
    do {
      puVar6 = xe + 1;
      *xe = *x1 << sVar1 | local_4c;
      pUVar5 = x1 + 1;
      local_4c = *x1 >> (0x20U - sVar1 & 0x1f);
      xe = puVar6;
      x1 = pUVar5;
    } while (pUVar5 < pUVar4);
    *puVar6 = local_4c;
    if (local_4c != 0) {
      b1._4_4_ = iVar2 + 2;
    }
  }
  pBVar3->wds = b1._4_4_ + -1;
  Bfree(b);
  return pBVar3;
}

Assistant:

static Bigint *
lshift(Bigint *b, int k MTd)
{
	int i, k1, n, n1;
	Bigint *b1;
	ULong *x, *x1, *xe, z;

#ifdef Pack_32
	n = k >> 5;
#else
	n = k >> 4;
#endif
	k1 = b->k;
	n1 = n + b->wds + 1;
	for(i = b->maxwds; n1 > i; i <<= 1)
		k1++;
	b1 = Balloc(k1 MTa);
	x1 = b1->x;
	for(i = 0; i < n; i++)
		*x1++ = 0;
	x = b->x;
	xe = x + b->wds;
#ifdef Pack_32
	if (k &= 0x1f) {
		k1 = 32 - k;
		z = 0;
		do {
			*x1++ = *x << k | z;
			z = *x++ >> k1;
			}
			while(x < xe);
		if ((*x1 = z))
			++n1;
		}
#else
	if (k &= 0xf) {
		k1 = 16 - k;
		z = 0;
		do {
			*x1++ = *x << k  & 0xffff | z;
			z = *x++ >> k1;
			}
			while(x < xe);
		if (*x1 = z)
			++n1;
		}
#endif
	else do
		*x1++ = *x++;
		while(x < xe);
	b1->wds = n1 - 1;
	Bfree(b MTa);
	return b1;
	}